

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::NotImplementedException<duckdb_libpgquery::PGTransactionStmtKind>
          (NotImplementedException *this,string *msg,PGTransactionStmtKind params)

{
  string local_30;
  
  Exception::ConstructMessage<duckdb_libpgquery::PGTransactionStmtKind>(&local_30,msg,params);
  NotImplementedException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}